

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_expand_data.cc
# Opt level: O2

void __thiscall
ctemplate::PerExpandData::InsertForModifiers(PerExpandData *this,char *key,void *value)

{
  _Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *ppvVar1;
  char *key_local;
  
  this_00 = (_Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)this->map_;
  key_local = key;
  if (this_00 ==
      (_Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       *)0x0) {
    this_00 = (_Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)operator_new(0x38);
    *(_Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      **)this_00 = this_00 + 0x30;
    *(size_type *)(this_00 + 8) = 1;
    *(_Hash_node_base **)(this_00 + 0x10) = (_Hash_node_base *)0x0;
    *(size_type *)(this_00 + 0x18) = 0;
    *(undefined4 *)(this_00 + 0x20) = 0x3f800000;
    *(size_t *)(this_00 + 0x28) = 0;
    *(__node_base_ptr *)(this_00 + 0x30) = (__node_base_ptr)0x0;
    this->map_ = (DataMap *)this_00;
  }
  ppvVar1 = std::__detail::
            _Map_base<const_char_*,_std::pair<const_char_*const,_const_void_*>,_std::allocator<std::pair<const_char_*const,_const_void_*>_>,_std::__detail::_Select1st,_ctemplate::PerExpandData::DataEq,_ctemplate::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](this_00,&key_local);
  *ppvVar1 = value;
  return;
}

Assistant:

void PerExpandData::InsertForModifiers(const char* key, const void* value) {
  if (!map_)
    map_ = new DataMap;
  (*map_)[key] = value;
}